

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O1

int Page_Navigation(_func_int_FORM_ptr *fct,FORM *form)

{
  _Bool _Var1;
  int iVar2;
  
  _Var1 = _nc_Internal_Validation(form);
  iVar2 = -0xd;
  if (_Var1) {
    if (form != (FORM *)0x0) {
      if (form->fieldterm != (_func_void_formnode_ptr *)0x0) {
        *(byte *)&form->status = (byte)form->status | 2;
        (*form->fieldterm)(form);
        *(byte *)&form->status = (byte)form->status & 0xfd;
      }
      if (form->formterm != (_func_void_formnode_ptr *)0x0) {
        *(byte *)&form->status = (byte)form->status | 2;
        (*form->formterm)(form);
        *(byte *)&form->status = (byte)form->status & 0xfd;
      }
    }
    iVar2 = (*fct)(form);
    if (form != (FORM *)0x0) {
      if (form->forminit != (_func_void_formnode_ptr *)0x0) {
        *(byte *)&form->status = (byte)form->status | 2;
        (*form->forminit)(form);
        *(byte *)&form->status = (byte)form->status & 0xfd;
      }
      if (form->fieldinit != (_func_void_formnode_ptr *)0x0) {
        *(byte *)&form->status = (byte)form->status | 2;
        (*form->fieldinit)(form);
        *(byte *)&form->status = (byte)form->status & 0xfd;
      }
    }
  }
  return iVar2;
}

Assistant:

static int Page_Navigation(int (* const fct) (FORM *), FORM * form)
{
  int res;

  if (!_nc_Internal_Validation(form)) 
    res = E_INVALID_FIELD;
  else
    {
      Call_Hook(form,fieldterm);
      Call_Hook(form,formterm);
      res = fct(form);
      Call_Hook(form,forminit);
      Call_Hook(form,fieldinit);
    }
  return res;
}